

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# kernel_type.hpp
# Opt level: O3

void __thiscall
ExchCXX::detail::BuiltinKernelImpl<ExchCXX::BuiltinPC07_K,void>::
eval_exc_inc_<double&,int&,double_const*&,double_const*&,double_const*&,double_const*&,double*&>
          (BuiltinKernelImpl<ExchCXX::BuiltinPC07_K,void> *this,double *args,int *args_1,
          double **args_2,double **args_3,double **args_4,double **args_5,double **args_6)

{
  double scal_fact;
  double rho;
  uint N;
  const_host_buffer_type rho_00;
  const_host_buffer_type sigma;
  const_host_buffer_type lapl;
  const_host_buffer_type tau;
  host_buffer_type eps;
  ulong uVar1;
  double sigma_00;
  double dVar2;
  double tau_00;
  double dStack_38;
  
  scal_fact = *args;
  N = *args_1;
  rho_00 = *args_2;
  sigma = *args_3;
  lapl = *args_4;
  tau = *args_5;
  eps = *args_6;
  if (*(int *)(this + 8) == 0) {
    host_eval_exc_inc_helper_polar<ExchCXX::BuiltinPC07_K>(scal_fact,N,rho_00,sigma,lapl,tau,eps);
    return;
  }
  if (0 < (int)N) {
    uVar1 = 0;
    do {
      rho = rho_00[uVar1];
      dVar2 = 0.0;
      if (1e-15 < rho) {
        dVar2 = sigma[uVar1];
        sigma_00 = 1.0000000000000052e-40;
        if (1.0000000000000052e-40 <= dVar2) {
          sigma_00 = dVar2;
        }
        dVar2 = tau[uVar1];
        tau_00 = 0.0;
        if (0.0 <= dVar2) {
          tau_00 = dVar2;
        }
        kernel_traits<ExchCXX::BuiltinPC07_K>::eval_exc_unpolar_impl
                  (rho,sigma_00,lapl[uVar1],tau_00,&dStack_38);
        dVar2 = dStack_38;
      }
      eps[uVar1] = dVar2 * scal_fact + eps[uVar1];
      uVar1 = uVar1 + 1;
    } while (N != uVar1);
  }
  return;
}

Assistant:

void eval_exc_inc_(Args&&... args) const {
    if( is_polarized() )
      host_eval_exc_inc_helper_polar<KernelType>(
        std::forward<Args>(args)...
      );
    else
      host_eval_exc_inc_helper_unpolar<KernelType>(
        std::forward<Args>(args)...
      );
  }